

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CMeshSceneNode.cpp
# Opt level: O2

void __thiscall irr::scene::CMeshSceneNode::setMesh(CMeshSceneNode *this,IMesh *mesh)

{
  IMesh *pIVar1;
  
  if (mesh != (IMesh *)0x0) {
    *(int *)(&mesh->field_0x10 + (long)mesh->_vptr_IMesh[-3]) =
         *(int *)(&mesh->field_0x10 + (long)mesh->_vptr_IMesh[-3]) + 1;
    pIVar1 = this->Mesh;
    if (pIVar1 != (IMesh *)0x0) {
      IReferenceCounted::drop
                ((IReferenceCounted *)((long)&pIVar1->_vptr_IMesh + (long)pIVar1->_vptr_IMesh[-3]));
    }
    this->Mesh = mesh;
    copyMaterials(this);
    return;
  }
  return;
}

Assistant:

void CMeshSceneNode::setMesh(IMesh *mesh)
{
	if (mesh) {
		mesh->grab();
		if (Mesh)
			Mesh->drop();

		Mesh = mesh;
		copyMaterials();
	}
}